

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::RsProdItemSyntax::setChild(RsProdItemSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined1 uVar1;
  NumericTokenFlags NVar2;
  uint32_t uVar3;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  logic_error *this_00;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  long lVar10;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 1) {
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    lVar10 = 0x20;
    if (*ppSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar6 = *ppSVar5;
      if (*(int *)&pSVar6->kind != 0x11) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ArgumentListSyntax]");
      }
    }
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar7 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar8) {
        local_d0.field_2._M_allocated_capacity = *psVar8;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar8;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x2c5b);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar7;
      plVar9 = plVar7 + 2;
      if (local_b0 == plVar9) {
        local_a0 = *plVar9;
        lStack_98 = plVar7[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar9;
      }
      local_a8 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar7;
      plVar9 = plVar7 + 2;
      if (local_f0 == plVar9) {
        local_e0 = *plVar9;
        lStack_d8 = plVar7[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar9;
      }
      local_e8 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pvVar4 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar1 = pvVar4->field_0x2;
    NVar2.raw = (pvVar4->numFlags).raw;
    uVar3 = pvVar4->rawLen;
    pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar4->info;
    (this->name).kind = pvVar4->kind;
    (this->name).field_0x2 = uVar1;
    (this->name).numFlags = (NumericTokenFlags)NVar2.raw;
    (this->name).rawLen = uVar3;
    lVar10 = 0x18;
  }
  *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)
   ((long)&(this->super_RsProdSyntax).super_SyntaxNode.parent + lVar10) = pSVar6;
  return;
}

Assistant:

void RsProdItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: argList = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}